

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O2

void __thiscall PrimitiveExpression<String>::~PrimitiveExpression(PrimitiveExpression<String> *this)

{
  ~PrimitiveExpression(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

PrimitiveExpression() = default;